

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingPointers.cpp
# Opt level: O2

int main(void)

{
  Session *pSVar1;
  atomic<unsigned_long> aVar2;
  SessionWriter *pSVar3;
  __atomic_base<unsigned_long> _Var4;
  nanoseconds nVar5;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *out;
  __uniq_ptr_impl<int,_std::default_delete<int>_> *in_R8;
  cx_string<12UL> cVar6;
  allocator local_38c;
  allocator local_38b;
  allocator local_38a;
  allocator local_389;
  unique_ptr<int,_std::default_delete<int>_> uptr;
  allocator local_379;
  address local_378;
  int *ptr;
  __uniq_ptr_impl<int,_std::default_delete<int>_> local_368;
  undefined8 local_360;
  shared_ptr<int> sptr;
  int value;
  cx_string<50UL> local_340;
  undefined1 local_308 [48];
  string local_2d8 [32];
  string local_2b8 [32];
  uint64_t local_298;
  string local_290 [32];
  string local_270 [32];
  undefined1 local_250 [48];
  string local_220 [32];
  string local_200 [32];
  uint64_t local_1e0;
  string local_1d8 [32];
  string local_1b8 [32];
  undefined1 local_198 [48];
  string local_168 [32];
  string local_148 [32];
  uint64_t local_128;
  string local_120 [32];
  string local_100 [32];
  undefined1 local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  uint64_t local_70;
  string local_68 [32];
  string local_48 [32];
  
  ptr = (int *)0x0;
  uptr._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)operator_new(4);
  *(undefined4 *)
   uptr._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
   super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
   _M_head_impl = 1;
  local_340._data._0_4_ = 2;
  std::make_shared<int,int>((int *)&sptr);
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_e0._0_8_ = 0;
      local_e0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_e0 + 0x10),"main",(allocator *)&local_368);
      std::__cxx11::string::string(local_b0,"main",(allocator *)&local_378);
      std::__cxx11::string::string
                (local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingPointers.cpp"
                 ,(allocator *)&local_360);
      local_70 = 0xe;
      std::__cxx11::string::string(local_68,"Pointers: {} {} {}",(allocator *)&value);
      cVar6 = binlog::detail::
              concatenated_tags<char_const(&)[19],int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
                        ((char (*) [19])"Pointers: {} {} {}",&ptr,&uptr,&sptr);
      local_340._data._0_8_ = cVar6._data._0_8_;
      local_340._data._8_4_ = cVar6._data._8_4_;
      local_340._data[0xc] = cVar6._data[0xc];
      std::__cxx11::string::string(local_48,local_340._data,&local_38c);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_e0);
      binlog::EventSource::~EventSource((EventSource *)local_e0);
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_R8 = (__uniq_ptr_impl<int,_std::default_delete<int>_> *)&uptr;
    binlog::SessionWriter::
    addEvent<int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,&ptr,
               (unique_ptr<int,_std::default_delete<int>_> *)in_R8,&sptr);
  }
  ptr = &value;
  value = 3;
  std::__uniq_ptr_impl<int,_std::default_delete<int>_>::reset
            ((__uniq_ptr_impl<int,_std::default_delete<int>_> *)&uptr,(pointer)0x0);
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::reset
            (&sptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>);
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_198._0_8_ = 0;
      local_198._8_2_ = info;
      std::__cxx11::string::string((string *)(local_198 + 0x10),"main",(allocator *)&local_368);
      std::__cxx11::string::string(local_168,"main",(allocator *)&local_378);
      std::__cxx11::string::string
                (local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingPointers.cpp"
                 ,(allocator *)&local_360);
      local_128 = 0x16;
      std::__cxx11::string::string(local_120,"Pointers: {} {} {}",&local_38c);
      cVar6 = binlog::detail::
              concatenated_tags<char_const(&)[19],int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
                        ((char (*) [19])"Pointers: {} {} {}",&ptr,&uptr,&sptr);
      local_340._data._0_8_ = cVar6._data._0_8_;
      local_340._data._8_4_ = cVar6._data._8_4_;
      local_340._data[0xc] = cVar6._data[0xc];
      std::__cxx11::string::string(local_100,local_340._data,&local_38b);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_198);
      binlog::EventSource::~EventSource((EventSource *)local_198);
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_R8 = (__uniq_ptr_impl<int,_std::default_delete<int>_> *)&uptr;
    binlog::SessionWriter::
    addEvent<int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,&ptr,
               (unique_ptr<int,_std::default_delete<int>_> *)in_R8,&sptr);
  }
  local_368._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int>_>)
       (_Tuple_impl<0UL,_int_*,_std::default_delete<int>_>)0xf777123;
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_250._0_8_ = 0;
      local_250._8_2_ = info;
      std::__cxx11::string::string((string *)(local_250 + 0x10),"main",(allocator *)&local_360);
      std::__cxx11::string::string(local_220,"main",&local_38c);
      std::__cxx11::string::string
                (local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingPointers.cpp"
                 ,&local_38b);
      local_1e0 = 0x29;
      std::__cxx11::string::string(local_1d8,"Raw pointer value: {} {}",&local_389);
      local_378.value = 0xf777123;
      binlog::detail::concatenated_tags<char_const(&)[25],binlog::address,void*&>
                (&local_340,(detail *)"Raw pointer value: {} {}",(char (*) [25])&local_378,
                 (address *)&local_368,(void **)in_R8);
      std::__cxx11::string::string(local_1b8,local_340._data,&local_38a);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_250);
      binlog::EventSource::~EventSource((EventSource *)local_250);
      LOCK();
      UNLOCK();
      main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    builtin_strncpy(local_340._data,"#qw\x0f",5);
    local_340._data[5] = '\0';
    local_340._data[6] = '\0';
    local_340._data[7] = '\0';
    in_R8 = &local_368;
    binlog::SessionWriter::addEvent<binlog::address,void*&>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (address *)&local_340,(void **)in_R8);
  }
  local_378.value = 0xf777123;
  pSVar3 = binlog::default_thread_local_writer();
  out = extraout_RDX;
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_308._0_8_ = 0;
      local_308._8_2_ = info;
      std::__cxx11::string::string((string *)(local_308 + 0x10),"main",&local_38c);
      std::__cxx11::string::string(local_2d8,"main",&local_38b);
      std::__cxx11::string::string
                (local_2b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingPointers.cpp"
                 ,&local_389);
      local_298 = 0x32;
      std::__cxx11::string::string(local_290,"Const pointer value: {} {}",&local_38a);
      local_360._0_1_ = '#';
      local_360._1_1_ = 'q';
      local_360._2_1_ = 'w';
      local_360._3_1_ = '\x0f';
      local_360._4_1_ = '\0';
      local_360._5_1_ = '\0';
      local_360._6_1_ = '\0';
      local_360._7_1_ = '\0';
      binlog::detail::concatenated_tags<char_const(&)[27],binlog::address,void_const*&>
                (&local_340,(detail *)"Const pointer value: {} {}",(char (*) [27])&local_360,
                 &local_378,(void **)in_R8);
      std::__cxx11::string::string(local_270,local_340._data,&local_379);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_308);
      binlog::EventSource::~EventSource((EventSource *)local_308);
      LOCK();
      UNLOCK();
      main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    builtin_strncpy(local_340._data,"#qw\x0f",5);
    local_340._data[5] = '\0';
    local_340._data[6] = '\0';
    local_340._data[7] = '\0';
    binlog::SessionWriter::addEvent<binlog::address,void_const*&>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (address *)&local_340,(void **)&local_378);
    out = extraout_RDX_00;
  }
  binlog::consume<std::ostream>((ConsumeResult *)&local_340,(binlog *)&std::cout,out);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&uptr);
  return 0;
}

Assistant:

int main()
{
  // Standard pointers

  //[stdptr
  int* ptr = nullptr;
  std::unique_ptr<int> uptr(std::make_unique<int>(1));
  std::shared_ptr<int> sptr(std::make_shared<int>(2));
  BINLOG_INFO("Pointers: {} {} {}", ptr, uptr, sptr);
  // Outputs: Pointers: {null} 1 2
  //]

  int value = 3;
  ptr = &value;
  uptr.reset();
  sptr.reset();
  BINLOG_INFO("Pointers: {} {} {}", ptr, uptr, sptr);
  // Outputs: Pointers: 3 {null} {null}

  // weak_ptr is not loggable by design, must be .lock()-ed first
  static_assert(
    !mserialize::detail::is_serializable<std::weak_ptr<int>>::value,
    "std::weak_ptr is not loggable"
  );

  // Addresses (raw pointer value)

  std::uintptr_t address = 0xf777123;

  int* any_pointer = nullptr;
  void* void_pointer = nullptr;
  std::memcpy(&any_pointer, &address, sizeof(any_pointer));
  std::memcpy(&void_pointer, &address, sizeof(void_pointer));

  //[address
  BINLOG_INFO("Raw pointer value: {} {}", binlog::address(any_pointer), void_pointer);
  // Outputs: Raw pointer value: 0xF777123 0xF777123
  //]

  const int* const_any_pointer = nullptr;
  const void* const_void_pointer = nullptr;
  std::memcpy(&const_any_pointer, &address, sizeof(const_any_pointer));
  std::memcpy(&const_void_pointer, &address, sizeof(const_void_pointer));

  BINLOG_INFO("Const pointer value: {} {}", binlog::address(const_any_pointer), const_void_pointer);
  // Outputs: Const pointer value: 0xF777123 0xF777123

  binlog::consume(std::cout);
  return 0;
}